

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_lazy2_dedicatedDictSearch
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  ZSTD_matchState_t *pZVar2;
  int iVar3;
  undefined8 uVar4;
  seqStore_t *psVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  size_t sVar9;
  ulong uVar10;
  int *piVar11;
  BYTE *pBVar12;
  BYTE *pBVar13;
  int *piVar14;
  long lVar15;
  int *piVar16;
  BYTE *pBVar17;
  int *piVar18;
  seqDef *psVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  size_t offbaseFound;
  uint local_c8;
  size_t local_c0;
  int *local_b8;
  ulong local_b0;
  ulong local_a8;
  uint local_9c;
  ZSTD_matchState_t *local_98;
  int *local_90;
  uint local_84;
  int *local_80;
  int *local_78;
  BYTE *local_70;
  BYTE *local_68;
  seqStore_t *local_60;
  BYTE *local_58;
  uint *local_50;
  BYTE *local_48;
  int *local_40;
  BYTE *local_38;
  
  local_68 = (ms->window).base;
  local_84 = (ms->window).dictLimit;
  local_b0 = (ulong)local_84;
  uVar6 = (ms->cParams).minMatch;
  uVar7 = 6;
  if (uVar6 < 6) {
    uVar7 = uVar6;
  }
  uVar6 = 4;
  if (4 < uVar7) {
    uVar6 = uVar7;
  }
  local_70 = local_68 + local_b0;
  local_c8 = *rep;
  pZVar2 = ms->dictMatchState;
  local_78 = (int *)(pZVar2->window).nextSrc;
  local_58 = (pZVar2->window).base;
  local_38 = local_58 + (pZVar2->window).dictLimit;
  uVar7 = ((int)src - ((int)local_70 + (int)local_38)) + (int)local_78;
  piVar18 = (int *)((long)src + (ulong)(uVar7 == 0));
  if (uVar7 < local_c8) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x603,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  uVar20 = rep[1];
  local_50 = rep;
  if (uVar7 < uVar20) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x604,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_b8 = (int *)((long)src + srcSize);
  local_80 = (int *)((long)src + (srcSize - 8));
  ms->lazySkipping = 0;
  if (piVar18 < local_80) {
    local_84 = ((int)local_58 - (int)local_78) + local_84;
    local_48 = local_58 + -(ulong)local_84;
    local_40 = local_b8 + -8;
    local_98 = ms;
    local_60 = seqStore;
    do {
      piVar14 = local_b8;
      local_90 = (int *)((long)piVar18 + 1);
      uVar7 = (((int)piVar18 - (int)local_68) - local_c8) + 1;
      piVar16 = (int *)(local_68 + uVar7);
      if (uVar7 < (uint)local_b0) {
        piVar16 = (int *)(local_58 + (uVar7 - local_84));
      }
      local_9c = uVar20;
      if ((uVar7 - (uint)local_b0 < 0xfffffffd) && (*piVar16 == *local_90)) {
        piVar11 = local_b8;
        if (uVar7 < (uint)local_b0) {
          piVar11 = local_78;
        }
        sVar9 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar18 + 5),(BYTE *)(piVar16 + 1),(BYTE *)local_b8,
                           (BYTE *)piVar11,local_70);
        uVar23 = sVar9 + 4;
      }
      else {
        uVar23 = 0;
      }
      pZVar2 = local_98;
      local_c0 = 999999999;
      if (uVar6 == 6) {
        uVar10 = ZSTD_HcFindBestMatch_dedicatedDictSearch_6
                           (local_98,(BYTE *)piVar18,(BYTE *)piVar14,&local_c0);
      }
      else if (uVar6 == 5) {
        uVar10 = ZSTD_HcFindBestMatch_dedicatedDictSearch_5
                           (local_98,(BYTE *)piVar18,(BYTE *)piVar14,&local_c0);
      }
      else {
        uVar10 = ZSTD_HcFindBestMatch_dedicatedDictSearch_4
                           (local_98,(BYTE *)piVar18,(BYTE *)piVar14,&local_c0);
      }
      uVar24 = uVar23;
      if (uVar23 < uVar10) {
        uVar24 = uVar10;
      }
      if (uVar24 < 4) {
        pZVar2->lazySkipping = (uint)(0x7ff < (ulong)((long)piVar18 - (long)src));
        piVar18 = (int *)((long)piVar18 + ((ulong)((long)piVar18 - (long)src) >> 8) + 1);
        uVar20 = local_9c;
      }
      else {
        piVar14 = piVar18;
        uVar21 = local_c0;
        if (uVar10 <= uVar23) {
          piVar14 = local_90;
          uVar21 = 1;
        }
        local_a8 = uVar24;
        local_90 = piVar14;
        if (piVar18 < local_80) {
          do {
            pZVar2 = local_98;
            piVar14 = (int *)((long)piVar18 + 1);
            uVar7 = ((int)piVar14 - (int)local_68) - local_c8;
            piVar16 = (int *)(local_68 + uVar7);
            if (uVar7 < (uint)local_b0) {
              piVar16 = (int *)(local_58 + (uVar7 - local_84));
            }
            if ((uVar7 - (uint)local_b0 < 0xfffffffd) && (*piVar16 == *piVar14)) {
              piVar11 = local_b8;
              if (uVar7 < (uint)local_b0) {
                piVar11 = local_78;
              }
              sVar9 = ZSTD_count_2segments
                                ((BYTE *)((long)piVar18 + 5),(BYTE *)(piVar16 + 1),(BYTE *)local_b8,
                                 (BYTE *)piVar11,local_70);
              uVar7 = (uint)uVar21;
              if (uVar7 == 0) goto LAB_001d971f;
              if (sVar9 < 0xfffffffffffffffc) {
                uVar20 = 0x1f;
                if (uVar7 != 0) {
                  for (; uVar7 >> uVar20 == 0; uVar20 = uVar20 - 1) {
                  }
                }
                if ((int)((uVar20 ^ 0x1f) + (int)local_a8 * 3 + -0x1e) < (int)(sVar9 + 4) * 3) {
                  uVar21 = 1;
                  local_a8 = sVar9 + 4;
                  local_90 = piVar14;
                }
              }
            }
            local_c0 = 999999999;
            if (uVar6 == 6) {
              uVar23 = ZSTD_HcFindBestMatch_dedicatedDictSearch_6
                                 (pZVar2,(BYTE *)piVar14,(BYTE *)local_b8,&local_c0);
            }
            else if (uVar6 == 5) {
              uVar23 = ZSTD_HcFindBestMatch_dedicatedDictSearch_5
                                 (pZVar2,(BYTE *)piVar14,(BYTE *)local_b8,&local_c0);
            }
            else {
              uVar23 = ZSTD_HcFindBestMatch_dedicatedDictSearch_4
                                 (pZVar2,(BYTE *)piVar14,(BYTE *)local_b8,&local_c0);
            }
            pZVar2 = local_98;
            uVar7 = (uint)local_c0;
            if ((uVar7 == 0) || (uVar20 = (uint)uVar21, uVar20 == 0)) goto LAB_001d971f;
            if (uVar23 < 4) {
LAB_001d91e6:
              uVar24 = local_a8;
              if (local_80 <= piVar14) break;
              piVar14 = (int *)((long)piVar18 + 2);
              uVar7 = ((int)piVar14 - (int)local_68) - local_c8;
              piVar16 = (int *)(local_68 + uVar7);
              if (uVar7 < (uint)local_b0) {
                piVar16 = (int *)(local_58 + (uVar7 - local_84));
              }
              if ((uVar7 - (uint)local_b0 < 0xfffffffd) && (*piVar16 == *piVar14)) {
                piVar11 = local_b8;
                if (uVar7 < (uint)local_b0) {
                  piVar11 = local_78;
                }
                sVar9 = ZSTD_count_2segments
                                  ((BYTE *)((long)piVar18 + 6),(BYTE *)(piVar16 + 1),
                                   (BYTE *)local_b8,(BYTE *)piVar11,local_70);
                uVar24 = local_a8;
                if (sVar9 < 0xfffffffffffffffc) {
                  uVar7 = 0x1f;
                  if (uVar20 != 0) {
                    for (; uVar20 >> uVar7 == 0; uVar7 = uVar7 - 1) {
                    }
                  }
                  if ((int)((uVar7 ^ 0x1f) + (int)local_a8 * 4 + -0x1e) < (int)(sVar9 + 4) * 4) {
                    uVar21 = 1;
                    uVar24 = sVar9 + 4;
                    local_90 = piVar14;
                  }
                }
              }
              local_c0 = 999999999;
              if (uVar6 == 6) {
                uVar23 = ZSTD_HcFindBestMatch_dedicatedDictSearch_6
                                   (pZVar2,(BYTE *)piVar14,(BYTE *)local_b8,&local_c0);
              }
              else if (uVar6 == 5) {
                uVar23 = ZSTD_HcFindBestMatch_dedicatedDictSearch_5
                                   (pZVar2,(BYTE *)piVar14,(BYTE *)local_b8,&local_c0);
              }
              else {
                uVar23 = ZSTD_HcFindBestMatch_dedicatedDictSearch_4
                                   (pZVar2,(BYTE *)piVar14,(BYTE *)local_b8,&local_c0);
              }
              uVar7 = (uint)local_c0;
              if ((uVar7 == 0) || (uVar20 = (uint)uVar21, uVar20 == 0)) {
LAB_001d971f:
                __assert_fail("val != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bits.h"
                              ,0xab,"unsigned int ZSTD_highbit32(U32)");
              }
              if (uVar23 < 4) break;
              iVar3 = 0x1f;
              if (uVar7 != 0) {
                for (; uVar7 >> iVar3 == 0; iVar3 = iVar3 + -1) {
                }
              }
              uVar7 = 0x1f;
              if (uVar20 != 0) {
                for (; uVar20 >> uVar7 == 0; uVar7 = uVar7 - 1) {
                }
              }
              if ((int)uVar23 * 4 - iVar3 <= (int)((uVar7 ^ 0x1f) + (int)uVar24 * 4 + -0x18)) break;
            }
            else {
              iVar3 = 0x1f;
              if (uVar7 != 0) {
                for (; uVar7 >> iVar3 == 0; iVar3 = iVar3 + -1) {
                }
              }
              uVar7 = 0x1f;
              if (uVar20 != 0) {
                for (; uVar20 >> uVar7 == 0; uVar7 = uVar7 - 1) {
                }
              }
              if ((int)uVar23 * 4 - iVar3 <= (int)((uVar7 ^ 0x1f) + (int)local_a8 * 4 + -0x1b))
              goto LAB_001d91e6;
            }
            uVar24 = uVar23;
            piVar18 = piVar14;
            uVar21 = local_c0;
            local_a8 = uVar24;
            local_90 = piVar14;
          } while (piVar14 < local_80);
        }
        piVar18 = local_90;
        if (3 < uVar21) {
          pBVar12 = (BYTE *)((long)local_90 + (-(long)local_68 - uVar21) + -0xfffffffd);
          pBVar13 = local_68;
          pBVar17 = local_70;
          if ((uint)pBVar12 < (uint)local_b0) {
            pBVar13 = local_48;
            pBVar17 = local_38;
          }
          if ((src < local_90) && (uVar23 = (ulong)pBVar12 & 0xffffffff, pBVar17 < pBVar13 + uVar23)
             ) {
            pBVar13 = pBVar13 + uVar23;
            do {
              piVar14 = (int *)((long)piVar18 + -1);
              pBVar13 = pBVar13 + -1;
              if ((*(BYTE *)piVar14 != *pBVar13) ||
                 (uVar24 = uVar24 + 1, piVar18 = piVar14, piVar14 <= src)) break;
            } while (pBVar17 < pBVar13);
          }
          local_9c = local_c8;
          local_c8 = (U32)uVar21 - 3;
        }
        if (local_60->maxNbSeq <=
            (ulong)((long)local_60->sequences - (long)local_60->sequencesStart >> 3)) {
LAB_001d97ba:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_60->maxNbLit) {
LAB_001d979b:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar23 = (long)piVar18 - (long)src;
        pBVar17 = local_60->lit;
        if (local_60->litStart + local_60->maxNbLit < pBVar17 + uVar23) {
LAB_001d973e:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_b8 < piVar18) {
LAB_001d975d:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a1,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_40 < piVar18) {
          ZSTD_safecopyLiterals(pBVar17,(BYTE *)src,(BYTE *)piVar18,(BYTE *)local_40);
LAB_001d945d:
          local_60->lit = local_60->lit + uVar23;
          if (0xffff < uVar23) {
            if (local_60->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x2b2,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            local_60->longLengthType = ZSTD_llt_literalLength;
            local_60->longLengthPos =
                 (U32)((ulong)((long)local_60->sequences - (long)local_60->sequencesStart) >> 3);
          }
        }
        else {
          uVar4 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar17 = *src;
          *(undefined8 *)(pBVar17 + 8) = uVar4;
          pBVar17 = local_60->lit;
          if (0x10 < uVar23) {
            if ((BYTE *)0xffffffffffffffe0 < pBVar17 + 0x10 + (-0x10 - ((long)src + 0x10))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar4 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar17 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar17 + 0x18) = uVar4;
            if (0x20 < (long)uVar23) {
              lVar15 = 0;
              do {
                puVar1 = (undefined8 *)((long)src + lVar15 + 0x20);
                uVar4 = puVar1[1];
                pBVar13 = pBVar17 + lVar15 + 0x20;
                *(undefined8 *)pBVar13 = *puVar1;
                *(undefined8 *)(pBVar13 + 8) = uVar4;
                puVar1 = (undefined8 *)((long)src + lVar15 + 0x30);
                uVar4 = puVar1[1];
                *(undefined8 *)(pBVar13 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar13 + 0x18) = uVar4;
                lVar15 = lVar15 + 0x20;
              } while (pBVar13 + 0x20 < pBVar17 + uVar23);
            }
            goto LAB_001d945d;
          }
          local_60->lit = pBVar17 + uVar23;
        }
        psVar5 = local_60;
        psVar19 = local_60->sequences;
        psVar19->litLength = (U16)uVar23;
        psVar19->offBase = (U32)uVar21;
        if (uVar24 < 3) {
LAB_001d977c:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,700,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar24 - 3) {
          if (local_60->longLengthType != ZSTD_llt_none) {
LAB_001d97d9:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2bf,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_60->longLengthType = ZSTD_llt_matchLength;
          local_60->longLengthPos =
               (U32)((ulong)((long)psVar19 - (long)local_60->sequencesStart) >> 3);
        }
        psVar19->mlBase = (U16)(uVar24 - 3);
        psVar19 = psVar19 + 1;
        local_60->sequences = psVar19;
        if (local_98->lazySkipping != 0) {
          local_98->lazySkipping = 0;
        }
        src = (void *)((long)piVar18 + uVar24);
        piVar18 = (int *)src;
        uVar20 = local_9c;
        uVar7 = local_9c;
        if (src <= local_80) {
          do {
            uVar22 = uVar7;
            uVar7 = local_c8;
            piVar14 = local_b8;
            uVar8 = ((int)src - (int)local_68) - uVar22;
            pBVar17 = local_68;
            if (uVar8 < (uint)local_b0) {
              pBVar17 = local_48;
            }
            piVar18 = (int *)src;
            uVar20 = uVar22;
            local_c8 = uVar7;
            if ((0xfffffffc < uVar8 - (uint)local_b0) || (*(int *)(pBVar17 + uVar8) != *src)) break;
            piVar18 = local_b8;
            if (uVar8 < (uint)local_b0) {
              piVar18 = local_78;
            }
            sVar9 = ZSTD_count_2segments
                              ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar17 + uVar8) + 4),
                               (BYTE *)local_b8,(BYTE *)piVar18,local_70);
            if (psVar5->maxNbSeq <= (ulong)((long)psVar19 - (long)psVar5->sequencesStart >> 3))
            goto LAB_001d97ba;
            if (0x20000 < psVar5->maxNbLit) goto LAB_001d979b;
            pBVar17 = psVar5->lit;
            if (psVar5->litStart + psVar5->maxNbLit < pBVar17) goto LAB_001d973e;
            if (piVar14 < src) goto LAB_001d975d;
            if (local_40 < src) {
              ZSTD_safecopyLiterals(pBVar17,(BYTE *)src,(BYTE *)src,(BYTE *)local_40);
            }
            else {
              uVar4 = *(undefined8 *)((long)src + 8);
              *(undefined8 *)pBVar17 = *src;
              *(undefined8 *)(pBVar17 + 8) = uVar4;
            }
            psVar19 = psVar5->sequences;
            psVar19->litLength = 0;
            psVar19->offBase = 1;
            if (sVar9 + 4 < 3) goto LAB_001d977c;
            if (0xffff < sVar9 + 1) {
              if (psVar5->longLengthType != ZSTD_llt_none) goto LAB_001d97d9;
              psVar5->longLengthType = ZSTD_llt_matchLength;
              psVar5->longLengthPos =
                   (U32)((ulong)((long)psVar19 - (long)psVar5->sequencesStart) >> 3);
            }
            psVar19->mlBase = (U16)(sVar9 + 1);
            psVar19 = psVar19 + 1;
            psVar5->sequences = psVar19;
            src = (void *)((long)src + sVar9 + 4);
            piVar18 = (int *)src;
            uVar20 = uVar7;
            local_c8 = uVar22;
          } while (src <= local_80);
        }
      }
    } while (piVar18 < local_80);
  }
  *local_50 = local_c8;
  local_50[1] = uVar20;
  return (long)local_b8 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy2_dedicatedDictSearch(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 2, ZSTD_dedicatedDictSearch);
}